

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O3

void getsyscolor(char *key1,char *key2,char *arg,char *defarg,_func_void_uchar_uchar_uchar *func)

{
  int iVar1;
  char *pcVar2;
  XColor x;
  undefined1 auStack_28 [9];
  uchar local_1f;
  uchar local_1d;
  uchar local_1b;
  
  if ((arg == (char *)0x0) &&
     (pcVar2 = (char *)XGetDefault(fl_display,key1,key2), arg = defarg, pcVar2 != (char *)0x0)) {
    arg = pcVar2;
  }
  iVar1 = XParseColor(fl_display,fl_colormap,arg,auStack_28);
  if (iVar1 == 0) {
    (*Fl::error)("Unknown color: %s",arg);
  }
  else {
    (*func)(local_1f,local_1d,local_1b);
  }
  return;
}

Assistant:

static void
getsyscolor(const char *key1, const char* key2, const char *arg, const char *defarg, void (*func)(uchar,uchar,uchar))
{
  if (!arg) {
    arg = XGetDefault(fl_display, key1, key2);
    if (!arg) arg = defarg;
  }
  XColor x;
  if (!XParseColor(fl_display, fl_colormap, arg, &x))
    Fl::error("Unknown color: %s", arg);
  else
    func(x.red>>8, x.green>>8, x.blue>>8);
}